

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O3

void snga_add_patch_values
               (Integer type,void *alpha,void *beta,Integer ndim,Integer *loC,Integer *hiC,
               Integer *ldC,void *A_ptr,void *B_ptr,void *C_ptr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  Integer baseldC [7];
  Integer bunit [7];
  long lStack_e0;
  undefined1 local_d8 [40];
  Integer local_b0;
  long local_a8 [8];
  long local_68 [7];
  
  lVar14 = 1;
  if (1 < ndim) {
    lVar12 = 1;
    do {
      lVar14 = lVar14 * ((hiC[lVar12] - loC[lVar12]) + 1);
      lVar12 = lVar12 + 1;
    } while (ndim != lVar12);
  }
  lStack_e0 = 0;
  local_68[0] = 1;
  local_68[1] = 1;
  local_a8[0] = *ldC;
  lVar12 = *ldC * ldC[1];
  local_a8[1] = lVar12;
  if (2 < ndim) {
    local_b0 = type;
    memset(local_d8,0,ndim * 8 - 0x10);
    lVar9 = 2;
    lVar13 = 1;
    do {
      lVar13 = lVar13 * ((hiC[lVar9 + -1] - loC[lVar9 + -1]) + 1);
      local_68[lVar9] = lVar13;
      lVar12 = lVar12 * ldC[lVar9];
      local_a8[lVar9] = lVar12;
      lVar9 = lVar9 + 1;
      type = local_b0;
    } while (ndim != lVar9);
  }
  switch(type) {
  case 0x3e9:
    if (0 < lVar14) {
      lVar12 = *hiC;
      lVar9 = *loC;
      lVar13 = 0;
      do {
        if (ndim < 2) {
          lVar15 = 0;
        }
        else {
          lVar16 = 0;
          lVar15 = 0;
          do {
            lVar15 = lVar15 + local_a8[lVar16] * *(long *)(local_d8 + lVar16 * 8 + -8);
            lVar11 = *(long *)(local_d8 + lVar16 * 8 + -8) +
                     (ulong)((lVar13 + 1) % local_68[lVar16 + 1] == 0);
            lVar10 = 0;
            if (lVar11 <= hiC[lVar16 + 1] - loC[lVar16 + 1]) {
              lVar10 = lVar11;
            }
            *(long *)(local_d8 + lVar16 * 8 + -8) = lVar10;
            lVar16 = lVar16 + 1;
          } while (ndim + -1 != lVar16);
        }
        if (lVar9 <= lVar12) {
          lVar16 = 0;
          do {
            *(int *)((long)C_ptr + lVar16 * 4 + lVar15 * 4) =
                 *(int *)((long)B_ptr + lVar16 * 4 + lVar15 * 4) * *beta +
                 *(int *)((long)A_ptr + lVar16 * 4 + lVar15 * 4) * *alpha;
            lVar16 = lVar16 + 1;
          } while ((lVar12 - lVar9) + 1 != lVar16);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar14);
    }
    break;
  case 0x3ea:
    if (0 < lVar14) {
      lVar12 = 0;
      do {
        if (ndim < 2) {
          lVar9 = 0;
        }
        else {
          lVar13 = 0;
          lVar9 = 0;
          do {
            lVar9 = lVar9 + local_a8[lVar13] * *(long *)(local_d8 + lVar13 * 8 + -8);
            lVar16 = *(long *)(local_d8 + lVar13 * 8 + -8) +
                     (ulong)((lVar12 + 1) % local_68[lVar13 + 1] == 0);
            lVar15 = 0;
            if (lVar16 <= hiC[lVar13 + 1] - loC[lVar13 + 1]) {
              lVar15 = lVar16;
            }
            *(long *)(local_d8 + lVar13 * 8 + -8) = lVar15;
            lVar13 = lVar13 + 1;
          } while (ndim + -1 != lVar13);
        }
        if (*loC <= *hiC) {
          lVar13 = -1;
          do {
            *(long *)((long)C_ptr + lVar13 * 8 + lVar9 * 8 + 8) =
                 *(long *)((long)B_ptr + lVar13 * 8 + lVar9 * 8 + 8) * *beta +
                 *(long *)((long)A_ptr + lVar13 * 8 + lVar9 * 8 + 8) * *alpha;
            lVar13 = lVar13 + 1;
          } while (lVar13 < *hiC - *loC);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar14);
    }
    break;
  case 0x3eb:
    if (0 < lVar14) {
      lVar12 = *hiC;
      lVar9 = *loC;
      lVar13 = 0;
      do {
        if (ndim < 2) {
          lVar15 = 0;
        }
        else {
          lVar16 = 0;
          lVar15 = 0;
          do {
            lVar15 = lVar15 + local_a8[lVar16] * *(long *)(local_d8 + lVar16 * 8 + -8);
            lVar11 = *(long *)(local_d8 + lVar16 * 8 + -8) +
                     (ulong)((lVar13 + 1) % local_68[lVar16 + 1] == 0);
            lVar10 = 0;
            if (lVar11 <= hiC[lVar16 + 1] - loC[lVar16 + 1]) {
              lVar10 = lVar11;
            }
            *(long *)(local_d8 + lVar16 * 8 + -8) = lVar10;
            lVar16 = lVar16 + 1;
          } while (ndim + -1 != lVar16);
        }
        if (lVar9 <= lVar12) {
          lVar16 = 0;
          do {
            *(float *)((long)C_ptr + lVar16 * 4 + lVar15 * 4) =
                 *alpha * *(float *)((long)A_ptr + lVar16 * 4 + lVar15 * 4) +
                 *beta * *(float *)((long)B_ptr + lVar16 * 4 + lVar15 * 4);
            lVar16 = lVar16 + 1;
          } while ((lVar12 - lVar9) + 1 != lVar16);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar14);
    }
    break;
  case 0x3ec:
    if (0 < lVar14) {
      lVar12 = *hiC;
      lVar9 = *loC;
      lVar13 = 0;
      do {
        if (ndim < 2) {
          lVar15 = 0;
        }
        else {
          lVar16 = 0;
          lVar15 = 0;
          do {
            lVar15 = lVar15 + local_a8[lVar16] * *(long *)(local_d8 + lVar16 * 8 + -8);
            lVar11 = *(long *)(local_d8 + lVar16 * 8 + -8) +
                     (ulong)((lVar13 + 1) % local_68[lVar16 + 1] == 0);
            lVar10 = 0;
            if (lVar11 <= hiC[lVar16 + 1] - loC[lVar16 + 1]) {
              lVar10 = lVar11;
            }
            *(long *)(local_d8 + lVar16 * 8 + -8) = lVar10;
            lVar16 = lVar16 + 1;
          } while (ndim + -1 != lVar16);
        }
        if (lVar9 <= lVar12) {
          lVar16 = 0;
          do {
            *(double *)((long)C_ptr + lVar16 * 8 + lVar15 * 8) =
                 *alpha * *(double *)((long)A_ptr + lVar16 * 8 + lVar15 * 8) +
                 *beta * *(double *)((long)B_ptr + lVar16 * 8 + lVar15 * 8);
            lVar16 = lVar16 + 1;
          } while ((lVar12 - lVar9) + 1 != lVar16);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar14);
    }
    break;
  default:
    pnga_error(" wrong data type ",type);
    return;
  case 0x3ee:
    if (0 < lVar14) {
      lVar12 = *hiC;
      lVar9 = *loC;
      lVar13 = 0;
      do {
        if (ndim < 2) {
          lVar15 = 0;
        }
        else {
          lVar16 = 0;
          lVar15 = 0;
          do {
            lVar15 = lVar15 + local_a8[lVar16] * *(long *)(local_d8 + lVar16 * 8 + -8);
            lVar11 = *(long *)(local_d8 + lVar16 * 8 + -8) +
                     (ulong)((lVar13 + 1) % local_68[lVar16 + 1] == 0);
            lVar10 = 0;
            if (lVar11 <= hiC[lVar16 + 1] - loC[lVar16 + 1]) {
              lVar10 = lVar11;
            }
            *(long *)(local_d8 + lVar16 * 8 + -8) = lVar10;
            lVar16 = lVar16 + 1;
          } while (ndim + -1 != lVar16);
        }
        if (lVar9 <= lVar12) {
          lVar16 = 0;
          do {
            uVar1 = *(undefined8 *)((long)A_ptr + lVar16 * 8 + lVar15 * 8);
            uVar2 = *(undefined8 *)((long)B_ptr + lVar16 * 8 + lVar15 * 8);
            fVar17 = (float)uVar1;
            fVar18 = (float)((ulong)uVar1 >> 0x20);
            fVar19 = (float)uVar2;
            fVar20 = (float)((ulong)uVar2 >> 0x20);
            *(ulong *)((long)C_ptr + lVar16 * 8 + lVar15 * 8) =
                 CONCAT44(*(float *)((long)beta + 4) * fVar19 +
                          *beta * fVar20 + *alpha * fVar18 + fVar17 * *(float *)((long)alpha + 4),
                          -*(float *)((long)beta + 4) * fVar20 +
                          *beta * fVar19 + *alpha * fVar17 + fVar18 * -*(float *)((long)alpha + 4));
            lVar16 = lVar16 + 1;
          } while ((lVar12 - lVar9) + 1 != lVar16);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar14);
    }
    break;
  case 0x3ef:
    if (0 < lVar14) {
      lVar12 = *hiC;
      lVar9 = *loC;
      lVar13 = 0;
      do {
        if (ndim < 2) {
          lVar15 = 0;
        }
        else {
          lVar16 = 0;
          lVar15 = 0;
          do {
            lVar15 = lVar15 + local_a8[lVar16] * *(long *)(local_d8 + lVar16 * 8 + -8);
            lVar11 = *(long *)(local_d8 + lVar16 * 8 + -8) +
                     (ulong)((lVar13 + 1) % local_68[lVar16 + 1] == 0);
            lVar10 = 0;
            if (lVar11 <= hiC[lVar16 + 1] - loC[lVar16 + 1]) {
              lVar10 = lVar11;
            }
            *(long *)(local_d8 + lVar16 * 8 + -8) = lVar10;
            lVar16 = lVar16 + 1;
          } while (ndim + -1 != lVar16);
        }
        if (lVar9 <= lVar12) {
          lVar15 = lVar15 << 4;
          lVar16 = (lVar12 - lVar9) + 1;
          do {
            dVar5 = *(double *)((long)A_ptr + lVar15);
            dVar6 = ((double *)((long)A_ptr + lVar15))[1];
            dVar7 = *(double *)((long)B_ptr + lVar15);
            dVar8 = ((double *)((long)B_ptr + lVar15))[1];
            dVar4 = *(double *)((long)beta + 8) * dVar7 +
                    *beta * dVar8 + *alpha * dVar6 + dVar5 * *(double *)((long)alpha + 8);
            auVar3._8_4_ = SUB84(dVar4,0);
            auVar3._0_8_ = -*(double *)((long)beta + 8) * dVar8 +
                           *beta * dVar7 + *alpha * dVar5 + dVar6 * -*(double *)((long)alpha + 8);
            auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
            *(undefined1 (*) [16])((long)C_ptr + lVar15) = auVar3;
            lVar15 = lVar15 + 0x10;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar14);
    }
    break;
  case 0x3f8:
    if (0 < lVar14) {
      lVar12 = *hiC;
      lVar9 = *loC;
      lVar13 = 0;
      do {
        if (ndim < 2) {
          lVar15 = 0;
        }
        else {
          lVar16 = 0;
          lVar15 = 0;
          do {
            lVar15 = lVar15 + local_a8[lVar16] * *(long *)(local_d8 + lVar16 * 8 + -8);
            lVar11 = *(long *)(local_d8 + lVar16 * 8 + -8) +
                     (ulong)((lVar13 + 1) % local_68[lVar16 + 1] == 0);
            lVar10 = 0;
            if (lVar11 <= hiC[lVar16 + 1] - loC[lVar16 + 1]) {
              lVar10 = lVar11;
            }
            *(long *)(local_d8 + lVar16 * 8 + -8) = lVar10;
            lVar16 = lVar16 + 1;
          } while (ndim + -1 != lVar16);
        }
        if (lVar9 <= lVar12) {
          lVar16 = 0;
          do {
            *(long *)((long)C_ptr + lVar16 * 8 + lVar15 * 8) =
                 *(long *)((long)B_ptr + lVar16 * 8 + lVar15 * 8) * *beta +
                 *(long *)((long)A_ptr + lVar16 * 8 + lVar15 * 8) * *alpha;
            lVar16 = lVar16 + 1;
          } while ((lVar12 - lVar9) + 1 != lVar16);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar14);
    }
  }
  return;
}

Assistant:

static void snga_add_patch_values(Integer type, void* alpha, void *beta,
                           Integer ndim, Integer *loC, Integer *hiC, Integer *ldC,
                           void *A_ptr, void *B_ptr, void *C_ptr)
{
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldC[MAXDIM];
  Integer idx, n1dim;
  Integer i, j;
  /* compute "local" add */

  /* number of n-element of the first dimension */
  n1dim = 1; for(i=1; i<ndim; i++) n1dim *= (hiC[i] - loC[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
  /* baseld[0] = ld[0]
   * baseld[1] = ld[0] * ld[1]
   * baseld[2] = ld[0] * ld[1] * ld[2] .....
   */
  baseldC[0] = ldC[0]; baseldC[1] = baseldC[0] *ldC[1];
  for(i=2; i<ndim; i++) {
    bvalue[i] = 0;
    bunit[i] = bunit[i-1] * (hiC[i-1] - loC[i-1] + 1);
    baseldC[i] = baseldC[i-1] * ldC[i];
  }

  switch(type){
    case C_DBL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((double*)C_ptr)[idx+j] =
            *(double*)alpha *
            ((double*)A_ptr)[idx+j] +
            *(double*)beta *
            ((double*)B_ptr)[idx+j];
      }
      break;
    case C_DCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++) {
          DoubleComplex a = ((DoubleComplex *)A_ptr)[idx+j];
          DoubleComplex b = ((DoubleComplex *)B_ptr)[idx+j];
          DoubleComplex x= *(DoubleComplex*)alpha;
          DoubleComplex y= *(DoubleComplex*)beta;
          ((DoubleComplex *)C_ptr)[idx+j].real = x.real*a.real -
            x.imag*a.imag + y.real*b.real - y.imag*b.imag;
          ((DoubleComplex *)C_ptr)[idx+j].imag = x.real*a.imag +
            x.imag*a.real + y.real*b.imag + y.imag*b.real;
        }
      }
      break;
    case C_SCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++) {
          SingleComplex a = ((SingleComplex *)A_ptr)[idx+j];
          SingleComplex b = ((SingleComplex *)B_ptr)[idx+j];
          SingleComplex x= *(SingleComplex*)alpha;
          SingleComplex y= *(SingleComplex*)beta;
          ((SingleComplex *)C_ptr)[idx+j].real = x.real*a.real -
            x.imag*a.imag + y.real*b.real - y.imag*b.imag;
          ((SingleComplex *)C_ptr)[idx+j].imag = x.real*a.imag +
            x.imag*a.real + y.real*b.imag + y.imag*b.real;
        }
      }
      break;
    case C_INT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((int*)C_ptr)[idx+j] = *(int *)alpha *
            ((int*)A_ptr)[idx+j] + *(int*)beta *
            ((int*)B_ptr)[idx+j];
      }
      break;
    case C_FLOAT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((float *)C_ptr)[idx+j] = *(float *)alpha *
            ((float *)A_ptr)[idx+j] + *(float *)beta *
            ((float *)B_ptr)[idx+j];
      }
      break;
    case C_LONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((long *)C_ptr)[idx+j] = *(long *)alpha *
            ((long *)A_ptr)[idx+j] + *(long *)beta *
            ((long *)B_ptr)[idx+j];
      }
      break;
    case C_LONGLONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((long long*)C_ptr)[idx+j] = *(long long*)alpha *
            ((long long*)A_ptr)[idx+j] + *(long long*)beta *
            ((long long*)B_ptr)[idx+j];
      }
      break;
    default: pnga_error(" wrong data type ",type);
  }
}